

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int mbedtls_ctr_drbg_reseed(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t len)

{
  ulong uVar1;
  int iVar2;
  size_t data_len;
  uchar seed [384];
  
  uVar1 = ctx->entropy_len;
  if (0x180 - uVar1 < len || 0x180 < uVar1) {
    iVar2 = -0x38;
  }
  else {
    memset(seed,0,0x180);
    iVar2 = (*ctx->f_entropy)(ctx->p_entropy,seed,uVar1);
    if (iVar2 == 0) {
      data_len = ctx->entropy_len;
      if (len != 0 && additional != (uchar *)0x0) {
        memcpy(seed + data_len,additional,len);
        data_len = data_len + len;
      }
      block_cipher_df(seed,seed,data_len);
      ctr_drbg_update_internal(ctx,seed);
      ctx->reseed_counter = 1;
      iVar2 = 0;
    }
    else {
      iVar2 = -0x34;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ctr_drbg_reseed( mbedtls_ctr_drbg_context *ctx,
                     const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;

    if( ctx->entropy_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT ||
        len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT - ctx->entropy_len )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( seed, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT );

    /*
     * Gather entropy_len bytes of entropy to seed state
     */
    if( 0 != ctx->f_entropy( ctx->p_entropy, seed,
                             ctx->entropy_len ) )
    {
        return( MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED );
    }

    seedlen += ctx->entropy_len;

    /*
     * Add additional data
     */
    if( additional && len )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /*
     * Reduce to 384 bits
     */
    block_cipher_df( seed, seed, seedlen );

    /*
     * Update state
     */
    ctr_drbg_update_internal( ctx, seed );
    ctx->reseed_counter = 1;

    return( 0 );
}